

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-c.cpp
# Opt level: O0

duckdb_statement_type duckdb::StatementTypeToC(StatementType statement_type)

{
  StatementType statement_type_local;
  duckdb_statement_type local_4;
  
  switch(statement_type) {
  case INVALID_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_INVALID;
    break;
  case SELECT_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_SELECT;
    break;
  case INSERT_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_INSERT;
    break;
  case UPDATE_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_UPDATE;
    break;
  case CREATE_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_CREATE;
    break;
  case DELETE_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_DELETE;
    break;
  case PREPARE_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_PREPARE;
    break;
  case EXECUTE_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_EXECUTE;
    break;
  case ALTER_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_ALTER;
    break;
  case TRANSACTION_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_TRANSACTION;
    break;
  case COPY_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_COPY;
    break;
  case ANALYZE_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_ANALYZE;
    break;
  case VARIABLE_SET_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_VARIABLE_SET;
    break;
  case CREATE_FUNC_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_CREATE_FUNC;
    break;
  case EXPLAIN_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_EXPLAIN;
    break;
  case DROP_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_DROP;
    break;
  case EXPORT_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_EXPORT;
    break;
  case PRAGMA_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_PRAGMA;
    break;
  case VACUUM_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_VACUUM;
    break;
  case CALL_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_CALL;
    break;
  case SET_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_SET;
    break;
  case LOAD_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_LOAD;
    break;
  case RELATION_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_RELATION;
    break;
  case EXTENSION_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_EXTENSION;
    break;
  case LOGICAL_PLAN_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_LOGICAL_PLAN;
    break;
  case ATTACH_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_ATTACH;
    break;
  case DETACH_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_DETACH;
    break;
  case MULTI_STATEMENT:
    local_4 = DUCKDB_STATEMENT_TYPE_MULTI;
    break;
  default:
    local_4 = DUCKDB_STATEMENT_TYPE_INVALID;
  }
  return local_4;
}

Assistant:

duckdb_statement_type StatementTypeToC(duckdb::StatementType statement_type) {
	switch (statement_type) {
	case duckdb::StatementType::SELECT_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_SELECT;
	case duckdb::StatementType::INVALID_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_INVALID;
	case duckdb::StatementType::INSERT_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_INSERT;
	case duckdb::StatementType::UPDATE_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_UPDATE;
	case duckdb::StatementType::EXPLAIN_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_EXPLAIN;
	case duckdb::StatementType::DELETE_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_DELETE;
	case duckdb::StatementType::PREPARE_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_PREPARE;
	case duckdb::StatementType::CREATE_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_CREATE;
	case duckdb::StatementType::EXECUTE_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_EXECUTE;
	case duckdb::StatementType::ALTER_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_ALTER;
	case duckdb::StatementType::TRANSACTION_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_TRANSACTION;
	case duckdb::StatementType::COPY_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_COPY;
	case duckdb::StatementType::ANALYZE_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_ANALYZE;
	case duckdb::StatementType::VARIABLE_SET_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_VARIABLE_SET;
	case duckdb::StatementType::CREATE_FUNC_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_CREATE_FUNC;
	case duckdb::StatementType::DROP_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_DROP;
	case duckdb::StatementType::EXPORT_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_EXPORT;
	case duckdb::StatementType::PRAGMA_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_PRAGMA;
	case duckdb::StatementType::VACUUM_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_VACUUM;
	case duckdb::StatementType::CALL_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_CALL;
	case duckdb::StatementType::SET_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_SET;
	case duckdb::StatementType::LOAD_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_LOAD;
	case duckdb::StatementType::RELATION_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_RELATION;
	case duckdb::StatementType::EXTENSION_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_EXTENSION;
	case duckdb::StatementType::LOGICAL_PLAN_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_LOGICAL_PLAN;
	case duckdb::StatementType::ATTACH_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_ATTACH;
	case duckdb::StatementType::DETACH_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_DETACH;
	case duckdb::StatementType::MULTI_STATEMENT:
		return DUCKDB_STATEMENT_TYPE_MULTI;
	default:
		return DUCKDB_STATEMENT_TYPE_INVALID;
	}
}